

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

List<Callback::Listener::Signal> * __thiscall
List<Callback::Listener::Signal>::operator=
          (List<Callback::Listener::Signal> *this,List<Callback::Listener::Signal> *other)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  
  pIVar4 = &this->endItem;
  pIVar1 = (this->_begin).item;
  if (pIVar1 != pIVar4) {
    pIVar3 = this->freeItem;
    do {
      pIVar2 = pIVar1;
      pIVar2->prev = pIVar3;
      this->freeItem = pIVar2;
      pIVar1 = pIVar2->next;
      pIVar3 = pIVar2;
    } while (pIVar2->next != pIVar4);
  }
  (this->_begin).item = pIVar4;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  for (pIVar4 = (other->_begin).item; pIVar4 != &other->endItem; pIVar4 = pIVar4->next) {
    insert(this,&this->_end,&pIVar4->value);
  }
  return this;
}

Assistant:

List& operator=(const List& other)
  {
    clear();
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->value);
    return *this;
  }